

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

mFILE * mstderr(void)

{
  mFILE *local_10;
  
  if (m_channel[2] == (mFILE *)0x0) {
    m_channel[2] = mfcreate((char *)0x0,0);
    if (m_channel[2] == (mFILE *)0x0) {
      local_10 = (mFILE *)0x0;
    }
    else {
      m_channel[2]->fp = _stderr;
      m_channel[2]->mode = 2;
      local_10 = m_channel[2];
    }
  }
  else {
    local_10 = m_channel[2];
  }
  return local_10;
}

Assistant:

mFILE *mstderr(void) {
    if (m_channel[2])
	return m_channel[2];

    m_channel[2] = mfcreate(NULL, 0);
    if (NULL == m_channel[2]) return NULL;
    m_channel[2]->fp = stderr;
    m_channel[2]->mode = MF_WRITE;
    return m_channel[2];
}